

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O3

bool __thiscall r_exec::HLPOverlay::scan_variable(HLPOverlay *this,uint16_t index)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  short sVar6;
  bool bVar7;
  Atom a;
  undefined4 local_44;
  HLPOverlay *local_40;
  ulong local_38;
  
  uVar5 = r_code::Atom::asIndex();
  local_38 = (ulong)uVar5;
  local_40 = this;
  bVar3 = r_code::Atom::getAtomCount();
  if (bVar3 != 0) {
    bVar7 = true;
    this = (HLPOverlay *)0x1;
    do {
      uVar1 = (long)&(this->super_Overlay).super__Object._vptr__Object + local_38;
      local_44 = *(undefined4 *)((local_40->super_Overlay).code + (uVar1 & 0xffff) * 4);
      cVar4 = r_code::Atom::getDescriptor();
      if (cVar4 == -0x73) {
        sVar6 = r_code::Atom::asIndex();
        if ((short)uVar1 == sVar6) {
          bVar3 = r_code::Atom::asAssignmentIndex();
          bVar3 = scan_location(local_40,(ushort)bVar3);
          r_code::Atom::~Atom((Atom *)&local_44);
          goto LAB_00176d9a;
        }
      }
      r_code::Atom::~Atom((Atom *)&local_44);
      bVar7 = this < (HLPOverlay *)(ulong)bVar3;
      lVar2 = (1 - (long)(ulong)bVar3) + (long)this;
      this = (HLPOverlay *)((long)&(this->super_Overlay).super__Object._vptr__Object + 1);
    } while (lVar2 != 1);
  }
  bVar3 = (byte)this;
  bVar7 = false;
LAB_00176d9a:
  return (bool)(bVar7 & bVar3);
}

Assistant:

bool HLPOverlay::scan_variable(uint16_t index)   // check if the variable can be bound.
{
    uint16_t guard_set_index = code[HLP_BWD_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) {
        uint16_t index = guard_set_index + i;
        Atom a = code[index];

        switch (a.getDescriptor()) {
        case Atom::ASSIGN_PTR:
            if (a.asIndex() == index) {
                return scan_location(a.asAssignmentIndex());
            }

            break;
        }
    }

    return false;
}